

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3fa.h
# Opt level: O3

double __thiscall embree::BVHNStatistics<4>::Statistics::sah(Statistics *this,BVH *bvh)

{
  undefined1 auVar1 [16];
  double dVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar13;
  float fVar14;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar8 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[0] -
          (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[0];
  fVar13 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[1] -
           (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[1];
  fVar14 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[2] -
           (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[2];
  fVar3 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[0] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[0];
  fVar4 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[1] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[1];
  fVar5 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[2] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[2];
  fVar16 = fVar3 - fVar8;
  fVar17 = fVar4 - fVar13;
  fVar18 = fVar5 - fVar14;
  fVar4 = fVar4 - fVar13;
  fVar5 = fVar5 - fVar14;
  fVar3 = fVar3 - fVar8;
  dVar2 = (double)(fVar3 * fVar18 * 0.33333334 +
                   (fVar8 * fVar18 + fVar14 * fVar3) * 0.5 + fVar14 * fVar8 +
                  fVar5 * fVar17 * 0.33333334 +
                  (fVar14 * fVar17 + fVar13 * fVar5) * 0.5 + fVar13 * fVar14 +
                  fVar4 * fVar16 * 0.33333334 +
                  (fVar13 * fVar16 + fVar8 * fVar4) * 0.5 + fVar8 * fVar13);
  auVar15._8_8_ = (this->statLeaf).leafSAH;
  auVar15._0_8_ = (this->statOBBNodes).nodeSAH;
  uVar6 = SUB84(dVar2,0);
  uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
  auVar10._8_4_ = uVar6;
  auVar10._0_8_ = dVar2;
  auVar10._12_4_ = uVar7;
  auVar15 = divpd(auVar15,auVar10);
  auVar9._8_8_ = (this->statAABBNodesMB).nodeSAH;
  auVar9._0_8_ = (this->statAABBNodesMB4D).nodeSAH;
  auVar12._8_4_ = uVar6;
  auVar12._0_8_ = dVar2;
  auVar12._12_4_ = uVar7;
  auVar10 = divpd(auVar9,auVar12);
  auVar11._8_8_ = (this->statOBBNodesMB).nodeSAH;
  auVar11._0_8_ = (this->statQuantizedNodes).nodeSAH;
  auVar1._8_4_ = uVar6;
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = uVar7;
  auVar12 = divpd(auVar11,auVar1);
  return auVar12._8_8_ +
         auVar10._8_8_ + auVar15._8_8_ + (this->statAABBNodes).nodeSAH / dVar2 + auVar15._0_8_ +
         auVar10._0_8_ + auVar12._0_8_;
}

Assistant:

__forceinline Vec3fa            ( const Vec3fa& other ) { m128 = other.m128; }